

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ruleset.cpp
# Opt level: O2

void __thiscall Ruleset::setEnabled(Ruleset *this,string *rule)

{
  pointer ppVar1;
  __type _Var2;
  invalid_argument *this_00;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rule_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rule_*>_>_>
  *__range1;
  byte bVar3;
  pointer ppVar4;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rule_*> pair
  ;
  
  ppVar1 = (this->m_nameToRule).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rule_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rule_*>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar3 = 0;
  for (ppVar4 = (this->m_nameToRule).
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rule_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rule_*>_>_>
                ._M_impl.super__Vector_impl_data._M_start; ppVar4 != ppVar1; ppVar4 = ppVar4 + 1) {
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rule_*>::
    pair(&pair,ppVar4);
    _Var2 = std::operator==(&pair.first,rule);
    bVar3 = bVar3 | _Var2;
    std::__cxx11::string::~string((string *)&pair);
  }
  if (bVar3 != 0) {
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string_const&>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&this->m_enabledRules,rule);
    rebuildRuleInstances(this);
    return;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"Rule is not implemented");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void Ruleset::setEnabled(std::string rule) {
    bool found = false;
    for(const auto pair : m_nameToRule){
        if(pair.first == rule){
            found = true;
        }
    }
    if(!found){
        throw std::invalid_argument("Rule is not implemented");
    }
    m_enabledRules.insert(rule);
    rebuildRuleInstances();
}